

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall MeshLib::List<MeshLib::Vertex>::contains(List<MeshLib::Vertex> *this,Vertex *t)

{
  ListNode<MeshLib::Vertex> *this_00;
  Vertex **ppVVar1;
  ListNode<MeshLib::Vertex> **ppLVar2;
  ListNode<MeshLib::Vertex> *h;
  Vertex *t_local;
  List<MeshLib::Vertex> *this_local;
  
  this_00 = this->m_head;
  while( true ) {
    if (this_00 == (ListNode<MeshLib::Vertex> *)0x0) {
      return false;
    }
    ppVVar1 = ListNode<MeshLib::Vertex>::data(this_00);
    if (*ppVVar1 == t) break;
    ppLVar2 = ListNode<MeshLib::Vertex>::next(this_00);
    this_00 = *ppLVar2;
  }
  return true;
}

Assistant:

bool List<T>::contains( T * t )
{
	ListNode<T> * h = m_head;

	if( !h )
	{
		return false;
	}
	
	do{
		if( h->data() == t ) return true;
		h = h->next();
	}while( h != NULL );

	return false;
}